

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_netinfo.cpp
# Opt level: O2

int D_GenderToInt(char *gender)

{
  int iVar1;
  
  iVar1 = strcasecmp(gender,"female");
  if (iVar1 == 0) {
    iVar1 = 1;
  }
  else {
    iVar1 = strcasecmp(gender,"other");
    if (iVar1 == 0) {
      iVar1 = 2;
    }
    else {
      iVar1 = strcasecmp(gender,"cyborg");
      iVar1 = (uint)(iVar1 == 0) * 2;
    }
  }
  return iVar1;
}

Assistant:

int D_GenderToInt (const char *gender)
{
	if (!stricmp (gender, "female"))
		return GENDER_FEMALE;
	else if (!stricmp (gender, "other") || !stricmp (gender, "cyborg"))
		return GENDER_NEUTER;
	else
		return GENDER_MALE;
}